

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystemData.cpp
# Opt level: O0

void __thiscall
DIS::AcousticEmitterSystemData::unmarshal(AcousticEmitterSystemData *this,DataStream *dataStream)

{
  undefined1 local_50 [8];
  AcousticBeamData x;
  size_t idx;
  DataStream *dataStream_local;
  AcousticEmitterSystemData *this_local;
  
  DataStream::operator>>(dataStream,&this->_emitterSystemDataLength);
  DataStream::operator>>(dataStream,&this->_numberOfBeams);
  DataStream::operator>>(dataStream,&this->_pad2);
  AcousticEmitterSystem::unmarshal(&this->_acousticEmitterSystem,dataStream);
  Vector3Float::unmarshal(&this->_emitterLocation,dataStream);
  std::vector<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>::clear
            (&this->_beamRecords);
  x._fundamentalDataParameters._deBeamwidth = 0.0;
  x._fundamentalDataParameters._28_4_ = 0;
  for (; (ulong)x._fundamentalDataParameters._24_8_ < (ulong)this->_numberOfBeams;
      x._fundamentalDataParameters._24_8_ = x._fundamentalDataParameters._24_8_ + 1) {
    AcousticBeamData::AcousticBeamData((AcousticBeamData *)local_50);
    AcousticBeamData::unmarshal((AcousticBeamData *)local_50,dataStream);
    std::vector<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>::push_back
              (&this->_beamRecords,(value_type *)local_50);
    AcousticBeamData::~AcousticBeamData((AcousticBeamData *)local_50);
  }
  return;
}

Assistant:

void AcousticEmitterSystemData::unmarshal(DataStream& dataStream)
{
    dataStream >> _emitterSystemDataLength;
    dataStream >> _numberOfBeams;
    dataStream >> _pad2;
    _acousticEmitterSystem.unmarshal(dataStream);
    _emitterLocation.unmarshal(dataStream);

     _beamRecords.clear();
     for(size_t idx = 0; idx < _numberOfBeams; idx++)
     {
        AcousticBeamData x;
        x.unmarshal(dataStream);
        _beamRecords.push_back(x);
     }
}